

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerWithAttr::GetProperty
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,Var originalInstance,
          JavascriptString *propertyNameString,Var *value,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  code *pcVar1;
  JavascriptString *originalInstance_00;
  Var instance_00;
  bool bVar2;
  charcount_t propertyNameLength_00;
  PropertyId propertyId;
  BOOL BVar3;
  undefined4 *puVar4;
  char16 *propertyName_00;
  RecyclableObject *pRVar5;
  charcount_t propertyNameLength;
  char16 *propertyName;
  PropertyRecord *propertyRecord;
  PropertyValueInfo *info_local;
  Var *value_local;
  JavascriptString *propertyNameString_local;
  Var originalInstance_local;
  DynamicObject *instance_local;
  PathTypeHandlerWithAttr *this_local;
  
  propertyRecord = (PropertyRecord *)info;
  info_local = (PropertyValueInfo *)value;
  value_local = (Var *)propertyNameString;
  propertyNameString_local = (JavascriptString *)originalInstance;
  originalInstance_local = instance;
  instance_local = (DynamicObject *)this;
  if (requestContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                ,0xefa,"(requestContext)","requestContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  propertyName_00 = JavascriptString::GetString((JavascriptString *)value_local);
  propertyNameLength_00 = JavascriptString::GetLength((JavascriptString *)value_local);
  bVar2 = DynamicObject::HasObjectArray((DynamicObject *)originalInstance_local);
  if (bVar2) {
    ScriptContext::GetOrAddPropertyRecord
              (requestContext,propertyName_00,propertyNameLength_00,(PropertyRecord **)&propertyName
              );
  }
  else {
    ScriptContext::FindPropertyRecord
              (requestContext,propertyName_00,propertyNameLength_00,(PropertyRecord **)&propertyName
              );
    if (propertyName == (char16 *)0x0) {
      pRVar5 = ScriptContext::GetMissingPropertyResult(requestContext);
      info_local->m_instance = pRVar5;
      return 0;
    }
  }
  instance_00 = originalInstance_local;
  originalInstance_00 = propertyNameString_local;
  propertyId = PropertyRecord::GetPropertyId((PropertyRecord *)propertyName);
  BVar3 = GetProperty(this,(DynamicObject *)instance_00,originalInstance_00,propertyId,
                      &info_local->m_instance,(PropertyValueInfo *)propertyRecord,requestContext);
  return BVar3;
}

Assistant:

BOOL PathTypeHandlerWithAttr::GetProperty(DynamicObject* instance, Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        // Consider: Implement actual string hash lookup
        Assert(requestContext);
        PropertyRecord const* propertyRecord;
        char16 const * propertyName = propertyNameString->GetString();
        charcount_t const propertyNameLength = propertyNameString->GetLength();

        if (instance->HasObjectArray())
        {
            requestContext->GetOrAddPropertyRecord(propertyName, propertyNameLength, &propertyRecord);
        }
        else
        {
            requestContext->FindPropertyRecord(propertyName, propertyNameLength, &propertyRecord);
            if (propertyRecord == nullptr)
            {
                *value = requestContext->GetMissingPropertyResult();
                return false;
            }
        }
        return PathTypeHandlerWithAttr::GetProperty(instance, originalInstance, propertyRecord->GetPropertyId(), value, info, requestContext);
    }